

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O1

void rhash_sha3_update(sha3_ctx *ctx,uchar *msg,size_t size)

{
  ulong uVar1;
  size_t __n;
  uint64_t *block;
  ulong block_size;
  ulong uVar2;
  uint64_t *__src;
  bool bVar3;
  
  uVar1 = (ulong)ctx->rest;
  if (-1 < (int)ctx->rest) {
    block_size = (ulong)ctx->block_size;
    ctx->rest = (uint)((uVar1 + size) % block_size);
    if (uVar1 != 0) {
      uVar2 = block_size - uVar1;
      __n = size;
      if (uVar2 < size) {
        __n = uVar2;
      }
      memcpy((void *)((long)ctx->message + uVar1),msg,__n);
      bVar3 = size < uVar2;
      size = size - uVar2;
      if (bVar3) {
        return;
      }
      rhash_sha3_process_block(ctx->hash,ctx->message,block_size);
      msg = msg + uVar2;
    }
    __src = (uint64_t *)msg;
    if (block_size <= size) {
      do {
        block = __src;
        if (((ulong)msg & 7) != 0) {
          memcpy(ctx->message,__src,block_size);
          block = ctx->message;
        }
        rhash_sha3_process_block(ctx->hash,block,block_size);
        __src = (uint64_t *)((long)__src + block_size);
        size = size - block_size;
        msg = (uchar *)((long)msg + block_size);
      } while (block_size <= size);
    }
    if (size != 0) {
      memcpy(ctx->message,__src,size);
      return;
    }
  }
  return;
}

Assistant:

void rhash_sha3_update(sha3_ctx *ctx, const unsigned char *msg, size_t size)
{
	size_t index = (size_t)ctx->rest;
	size_t block_size = (size_t)ctx->block_size;

	if (ctx->rest & SHA3_FINALIZED) return; /* too late for additional input */
	ctx->rest = (unsigned)((ctx->rest + size) % block_size);

	/* fill partial block */
	if (index) {
		size_t left = block_size - index;
		memcpy((char*)ctx->message + index, msg, (size < left ? size : left));
		if (size < left) return;

		/* process partial block */
		rhash_sha3_process_block(ctx->hash, ctx->message, block_size);
		msg  += left;
		size -= left;
	}
	while (size >= block_size) {
		uint64_t* aligned_message_block;
		if (IS_ALIGNED_64(msg)) {
			/* the most common case is processing of an already aligned message
			without copying it */
			aligned_message_block = (uint64_t*)msg;
		} else {
			memcpy(ctx->message, msg, block_size);
			aligned_message_block = ctx->message;
		}

		rhash_sha3_process_block(ctx->hash, aligned_message_block, block_size);
		msg  += block_size;
		size -= block_size;
	}
	if (size) {
		memcpy(ctx->message, msg, size); /* save leftovers */
	}
}